

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

void test_ranges_impl<trng::lagfib4plus<unsigned_long,168u,205u,242u,521u>,long_double>(void)

{
  AssertionHandler catchAssertionHandler;
  StringRef local_d0;
  AssertionHandler local_c0;
  SourceLineInfo local_78;
  StringRef local_68;
  StringRef local_58;
  StringRef local_48;
  StringRef local_38;
  
  local_d0.m_start = "REQUIRE";
  local_d0.m_size = 7;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc";
  local_78.line = 0x88;
  Catch::StringRef::StringRef(&local_38,"(x_min >= 0 and x_max <= 1)");
  Catch::AssertionHandler::AssertionHandler(&local_c0,&local_d0,&local_78,local_38,Normal);
  local_d0.m_start = (char *)CONCAT71(local_d0.m_start._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_d0);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0.m_start = "REQUIRE";
  local_d0.m_size = 7;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc";
  local_78.line = 0x8b;
  Catch::StringRef::StringRef(&local_48,"(x_min >= 0 and x_max < 1)");
  Catch::AssertionHandler::AssertionHandler(&local_c0,&local_d0,&local_78,local_48,Normal);
  local_d0.m_start = (char *)CONCAT71(local_d0.m_start._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_d0);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0.m_start = "REQUIRE";
  local_d0.m_size = 7;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc";
  local_78.line = 0x8e;
  Catch::StringRef::StringRef(&local_58,"(x_min > 0 and x_max <= 1)");
  Catch::AssertionHandler::AssertionHandler(&local_c0,&local_d0,&local_78,local_58,Normal);
  local_d0.m_start = (char *)CONCAT71(local_d0.m_start._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_d0);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0.m_start = "REQUIRE";
  local_d0.m_size = 7;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc";
  local_78.line = 0x91;
  Catch::StringRef::StringRef(&local_68,"(x_min > 0 and x_max < 1)");
  Catch::AssertionHandler::AssertionHandler(&local_c0,&local_d0,&local_78,local_68,Normal);
  local_d0.m_start = (char *)CONCAT71(local_d0.m_start._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_d0);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void test_ranges_impl() {
  generator_min<R> r_min;
  generator_max<R> r_max;
  using u01xx_min = trng::utility::u01xx_traits<T, 1, generator_min<R>>;
  using u01xx_max = trng::utility::u01xx_traits<T, 1, generator_max<R>>;
  T x_min{}, x_max{};
  x_min = u01xx_min::cc(r_min);
  x_max = u01xx_max::cc(r_max);
  REQUIRE((x_min >= 0 and x_max <= 1));
  x_min = u01xx_min::co(r_min);
  x_max = u01xx_max::co(r_max);
  REQUIRE((x_min >= 0 and x_max < 1));
  x_min = u01xx_min::oc(r_min);
  x_max = u01xx_max::oc(r_max);
  REQUIRE((x_min > 0 and x_max <= 1));
  x_min = u01xx_min::oo(r_min);
  x_max = u01xx_max::oo(r_max);
  REQUIRE((x_min > 0 and x_max < 1));
}